

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetainfoSet.cpp
# Opt level: O2

float __thiscall ser::MetainfoSet::AsFloat(MetainfoSet *this,string *key)

{
  bool bVar1;
  uint uVar2;
  const_iterator cVar3;
  type_info *this_00;
  ostream *poVar4;
  any *operand;
  _Base_ptr this_01;
  float fVar5;
  double dVar6;
  float v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  stringstream ss;
  ostream local_190 [376];
  
  cVar3 = checkKeyExists(this,key);
  if (*(long **)(cVar3._M_node + 2) == (long *)0x0) {
    this_00 = (type_info *)&void::typeinfo;
  }
  else {
    this_00 = (type_info *)(**(code **)(**(long **)(cVar3._M_node + 2) + 0x10))();
  }
  this_01 = cVar3._M_node + 2;
  bVar1 = std::type_info::operator==(this_00,(type_info *)&bool::typeinfo);
  if (bVar1) {
    bVar1 = boost::any_cast<bool>((any *)this_01);
    uVar2 = (uint)bVar1;
  }
  else {
    bVar1 = std::type_info::operator==(this_00,(type_info *)&int::typeinfo);
    if (!bVar1) {
      bVar1 = std::type_info::operator==(this_00,(type_info *)&float::typeinfo);
      if (bVar1) {
        fVar5 = boost::any_cast<float>((any *)this_01);
        return fVar5;
      }
      bVar1 = std::type_info::operator==(this_00,(type_info *)&double::typeinfo);
      if (bVar1) {
        dVar6 = boost::any_cast<double>((any *)this_01);
        return (float)dVar6;
      }
      bVar1 = std::type_info::operator==(this_00,(type_info *)&std::__cxx11::string::typeinfo);
      if (bVar1) {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        boost::any_cast<std::__cxx11::string>(&local_1c0,(boost *)this_01,operand);
        std::operator<<(local_190,(string *)&local_1c0);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::istream::_M_extract<float>((float *)&ss);
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
        return v;
      }
      poVar4 = std::operator<<((ostream *)&std::cerr,"Bug in MetainfoSet: type of \'");
      poVar4 = std::operator<<(poVar4,(string *)key);
      std::operator<<(poVar4,"\' not recognized\n");
      exit(1);
    }
    uVar2 = boost::any_cast<int>((any *)this_01);
  }
  return (float)(int)uVar2;
}

Assistant:

float MetainfoSet::AsFloat(const std::string& key) const
{
    std::map<std::string, boost::any>::const_iterator iter = checkKeyExists(key);
    const boost::any& a = iter->second;
    const std::type_info& t = a.type();

         if(t == typeid(bool)) return boost::any_cast<bool>(a);
    else if(t == typeid(int)) return boost::any_cast<int>(a);
    else if(t == typeid(float)) return boost::any_cast<float>(a);
    else if(t == typeid(double)) return boost::any_cast<double>(a);
    else if(t == typeid(std::string))
    {
        float v;
        std::stringstream ss;
        ss << boost::any_cast<std::string>(a);
        ss >> v;
        return v;
    }

    // Reaching this point is a bug.
    std::cerr << "Bug in MetainfoSet: type of '" << key << "' not recognized\n";
    std::exit(1);
    return (float)0.;
}